

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O1

void __thiscall
CanonicalizePathNotNullTerminated::~CanonicalizePathNotNullTerminated
          (CanonicalizePathNotNullTerminated *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CanonicalizePath, NotNullTerminated) {
  string path;
  string err;
  size_t len;
  uint64_t unused;

  path = "foo/. bar/.";
  len = strlen("foo/.");  // Canonicalize only the part before the space.
  EXPECT_TRUE(CanonicalizePath(&path[0], &len, &unused, &err));
  EXPECT_EQ(strlen("foo"), len);
  EXPECT_EQ("foo/. bar/.", string(path));

  path = "foo/../file bar/.";
  len = strlen("foo/../file");
  EXPECT_TRUE(CanonicalizePath(&path[0], &len, &unused, &err));
  EXPECT_EQ(strlen("file"), len);
  EXPECT_EQ("file ./file bar/.", string(path));
}